

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.cpp
# Opt level: O2

bool __thiscall
ParsePackage::ParseFuncCall
          (ParsePackage *this,char *buf,int len,string *func_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *func_str_map,vector<cppnet::Any,_std::allocator<cppnet::Any>_> *res)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  const_iterator cVar4;
  long lVar5;
  ParsePackage *__s1;
  ParsePackage *this_00;
  ParsePackage *pPVar6;
  int iVar7;
  bool bVar8;
  string func_str;
  
  if (buf == (char *)0x0) {
    bVar8 = false;
  }
  else {
    iVar2 = 0;
    func_str._M_dataplus._M_p = (pointer)&func_str.field_2;
    func_str._M_string_length = 0;
    func_str.field_2._M_local_buf[0] = '\0';
    iVar7 = 2;
    lVar5 = 0;
    __s1 = (ParsePackage *)buf;
    do {
      while( true ) {
        while( true ) {
          iVar1 = strcmp((char *)__s1,"\r\n\r\n");
          bVar8 = iVar1 == 0;
          if (((bVar8) || ((ParsePackage *)(buf + len) < __s1)) ||
             (this_00 = __s1, pcVar3 = strchr((char *)__s1,0x7c), pcVar3 == (char *)0x0))
          goto LAB_0010a0e1;
          pPVar6 = (ParsePackage *)(pcVar3 + 1);
          *pcVar3 = '\0';
          if (iVar7 != 2) break;
          std::__cxx11::string::assign((char *)func_name);
          cVar4 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find(&func_str_map->_M_t,func_name);
          if ((_Rb_tree_header *)cVar4._M_node ==
              &(func_str_map->_M_t)._M_impl.super__Rb_tree_header) goto LAB_0010a0e1;
          std::__cxx11::string::_M_assign((string *)&func_str);
          lVar5 = std::__cxx11::string::find((char *)&func_str,0x1202d6);
          lVar5 = lVar5 + 1;
          iVar7 = 3;
          __s1 = pPVar6;
        }
        if (iVar7 != 3) break;
        iVar2 = atoi((char *)__s1);
        iVar7 = 4;
        __s1 = pPVar6;
      }
      if (func_str._M_dataplus._M_p[lVar5] == 'v') {
        bVar8 = _ParseVec(this_00,(char *)__s1,func_str._M_dataplus._M_p[lVar5 + 1],res);
        if (!bVar8) {
LAB_0010a0de:
          bVar8 = false;
          goto LAB_0010a0e1;
        }
        lVar5 = lVar5 + 2;
      }
      else {
        bVar8 = _ParseParam(this_00,(char *)__s1,func_str._M_dataplus._M_p[lVar5],res);
        if (!bVar8) goto LAB_0010a0de;
        lVar5 = lVar5 + 1;
      }
      iVar7 = 4;
      iVar2 = iVar2 + -1;
      __s1 = pPVar6;
    } while ((iVar2 != 0) || (iVar2 = 0, func_str._M_dataplus._M_p[lVar5] != ')'));
    bVar8 = true;
LAB_0010a0e1:
    std::__cxx11::string::~string((string *)&func_str);
  }
  return bVar8;
}

Assistant:

bool ParsePackage::ParseFuncCall(char* buf, int len, std::string& func_name, const std::map<std::string, std::string>& func_str_map, std::vector<cppnet::Any>& res) {
    if (!buf) {
        return false;
    }
    char* end = buf + len;
    char* next = buf;
    char* pos = nullptr;
    char* cur = nullptr;

    int state = PARSE_NAME;
    int num = 0;
    std::string func_str;
    size_t index = 0;
    for (;;) {
        cur = next;
        if (strcmp(cur, "\r\n\r\n") == 0) {
            return true;
        }
        if (cur > end) {
            return false;
        }
        pos = strchr(cur, '|');
        if (pos) {
            next = pos + 1;
            *pos = '\0';

        } else {
            return false;
        }
        switch (state) {
        case PARSE_NAME:
        {
            func_name = cur;
            auto iter = func_str_map.find(func_name);
            if (iter != func_str_map.end()) {
                func_str = iter->second;
                state = PARSE_NUM;
                index = func_str.find("(") + 1;
                break;
            }
            return false;
        }
            
        case PARSE_NUM:
            num = atoi(cur);
            state = PARSE_PARAM;
            break;
        case PARSE_PARAM:
            if (func_str[index] == 'v') {
                if (_ParseVec(cur, func_str[++index], res)) {
                    num--;
                    index++;
                    if (num == 0 && func_str[index] == ')') {
                        return true;
                    }
                } else {
                    return false;
                }
            } else {
                if (_ParseParam(cur, func_str[index++], res)) {
                    num--;
                    if (num == 0 && func_str[index] == ')') {
                        return true;
                    }
                } else {
                    return false;
                }
            }
            break;
        }
    }
    return false;
}